

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O1

path * __thiscall boost::filesystem::path::remove_trailing_separator(path *this)

{
  size_type sVar1;
  pointer pcVar2;
  
  sVar1 = (this->m_pathname)._M_string_length;
  if ((sVar1 != 0) && (pcVar2 = (this->m_pathname)._M_dataplus._M_p, pcVar2[sVar1 - 1] == '/')) {
    (this->m_pathname)._M_string_length = sVar1 - 1;
    pcVar2[sVar1 - 1] = '\0';
  }
  return this;
}

Assistant:

path&  path::remove_trailing_separator()
  {
    if (!m_pathname.empty() && is_separator(m_pathname[m_pathname.size() - 1]))
      m_pathname.erase(m_pathname.size() - 1);
    return *this;
  }